

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int unres_data_diff_new(unres_data *unres,lyd_node *subtree,lyd_node *parent,int created)

{
  uint uVar1;
  lys_module *plVar2;
  lyd_node *local_38;
  char *parent_xpath;
  int created_local;
  lyd_node *parent_local;
  lyd_node *subtree_local;
  unres_data *unres_local;
  
  local_38 = (lyd_node *)0x0;
  if (created == 0) {
    if ((parent == (lyd_node *)0x0) ||
       (local_38 = (lyd_node *)lyd_path(parent), local_38 != (lyd_node *)0x0)) {
      uVar1 = unres->diff_idx;
      unres->diff_idx = uVar1 + 1;
      unres_local._4_4_ =
           lyd_difflist_add(unres->diff,&unres->diff_size,uVar1,LYD_DIFF_DELETED,subtree,local_38);
    }
    else {
      plVar2 = lyd_node_module(subtree);
      ly_log(plVar2->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","unres_data_diff_new");
      unres_local._4_4_ = -1;
    }
  }
  else {
    uVar1 = unres->diff_idx;
    unres->diff_idx = uVar1 + 1;
    unres_local._4_4_ =
         lyd_difflist_add(unres->diff,&unres->diff_size,uVar1,LYD_DIFF_CREATED,(lyd_node *)0x0,
                          subtree);
  }
  return unres_local._4_4_;
}

Assistant:

int
unres_data_diff_new(struct unres_data *unres, struct lyd_node *subtree, struct lyd_node *parent, int created)
{
    char *parent_xpath = NULL;

    if (created) {
        return lyd_difflist_add(unres->diff, &unres->diff_size, unres->diff_idx++, LYD_DIFF_CREATED, NULL, subtree);
    } else {
        if (parent) {
            parent_xpath = lyd_path(parent);
            LY_CHECK_ERR_RETURN(!parent_xpath, LOGMEM(lyd_node_module(subtree)->ctx), -1);
        }
        return lyd_difflist_add(unres->diff, &unres->diff_size, unres->diff_idx++, LYD_DIFF_DELETED,
                                subtree, (struct lyd_node *)parent_xpath);
    }
}